

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bootup.c
# Opt level: O1

void __thiscall CMud::LoadTime(CMud *this)

{
  long lVar1;
  long lVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  
  lVar1 = current_time + -0x39f53371;
  lVar2 = current_time + (lVar1 / 0x5a0) * -0x5a0;
  lVar8 = lVar2 + -0x39f53371;
  time_info.hour =
       (int)(SUB168(SEXT816(lVar8) * ZEXT816(0x8888888888888889),8) >> 5) -
       (SUB164(SEXT816(lVar8) * ZEXT816(0x8888888888888889),0xc) >> 0x1f);
  auVar3 = SEXT816((lVar1 / 0xa8c0) * -0xa8c0 + current_time + -0x39f53371) *
           SEXT816(0x2d82d82d82d82d83);
  time_info.day = auVar3._9_4_ - (auVar3._12_4_ >> 0x1f);
  lVar7 = SUB168(SEXT816(lVar1) * SEXT816(-0x7e8bd1fbb3a478db),8) + current_time + -0x39f53371;
  lVar7 = (lVar7 >> 0x12) - (lVar7 >> 0x3f);
  auVar3 = SEXT816(lVar7 * -0x7e900 + current_time + -0x39f53371) * SEXT816(0x1845c8a0ce512957);
  iVar6 = (int)(auVar3._8_8_ >> 0xc);
  iVar5 = auVar3._12_4_ >> 0x1f;
  time_info.month = iVar6 - iVar5;
  time_info.year = (int)lVar7 + 0x5eb;
  iVar6 = (iVar6 - iVar5) + 1;
  time_info.season =
       (int)(iVar6 + (((uint)(iVar6 / 6 + (iVar6 >> 0x1f)) >> 1) - (iVar6 >> 0x1f)) * -0xc) / 3;
  if (lVar8 < 300) {
    sun = 0;
  }
  else {
    sun = 1;
    if ((0x3b < lVar2 - 0x39f5349dU) && (sun = 2, 0x473 < lVar8)) {
      sun = (ushort)(lVar2 - 0x39f537e5U < 0x3c) * 3;
    }
  }
  auVar3 = SEXT816(lVar1 % 0x7e90) * SEXT816(0x2d82d82d82d82d83);
  auVar4 = SEXT816(lVar1 % 54000) * SEXT816(0x6d3a06d3a06d3a07);
  berus_pos = (short)(auVar3._8_8_ >> 4) - (auVar3._14_2_ >> 0xf);
  calabren_pos = (short)(auVar4._8_4_ >> 6) - (auVar4._14_2_ >> 0xf);
  return;
}

Assistant:

void CMud::LoadTime()
{
	long lhour;

	lhour = (current_time - 650336715) / (PULSE_TICK / PULSE_PER_SECOND);
	time_info.hour = ((current_time - RS_EPOCH) % (60 * 24)) / (60);
	time_info.day = ((current_time - RS_EPOCH) % (60 * 60 * 12)) / (60 * 24);
	time_info.month = ((current_time - RS_EPOCH) % (60 * 60 * 24 * 6)) / (60 * 60 * 12);
	time_info.year  = 1515 + (current_time - RS_EPOCH) / (60 * 60 * 24 * 6);
	time_info.season= ((time_info.month + 1) % 12) / 3;

	if ( time_info.hour <  5 )
		sun = SolarPosition::Dark;
	else if ( time_info.hour <  6 )
		sun = SolarPosition::Sunrise;
	else if ( time_info.hour < 19 )
		sun = SolarPosition::Daylight;
	else if ( time_info.hour < 20 )
		sun = SolarPosition::Sunset;
	else
		sun = SolarPosition::Dark;

	berus_pos = ((current_time-RS_EPOCH)%(LunarSpeed::Berus*360))/LunarSpeed::Berus;
	calabren_pos = ((current_time-RS_EPOCH)%(LunarSpeed::Calabren*360))/LunarSpeed::Calabren;
}